

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxels.cpp
# Opt level: O2

void __thiscall FVoxel::Remap(FVoxel *this)

{
  byte bVar1;
  int iVar2;
  int i_1;
  BYTE *pBVar3;
  int j;
  ulong uVar4;
  int i;
  long lVar5;
  byte *pbVar6;
  
  pBVar3 = this->Palette;
  if (pBVar3 == (BYTE *)0x0) {
    return;
  }
  if (GetVoxelRemap(unsigned_char_const*)::firsttime == '\x01') {
    iVar2 = bcmp(&GetVoxelRemap(unsigned_char_const*)::oldpal,pBVar3,0x300);
    if (iVar2 == 0) goto LAB_005f285b;
  }
  GetVoxelRemap(unsigned_char_const*)::firsttime = '\x01';
  memcpy(&GetVoxelRemap(unsigned_char_const*)::oldpal,pBVar3,0x300);
  pbVar6 = &DAT_00a151a2;
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    iVar2 = BestColor((uint32 *)&GPalette,(uint)(pbVar6[-2] >> 4) | (uint)pbVar6[-2] * 4,
                      (uint)(pbVar6[-1] >> 4) | (uint)pbVar6[-1] * 4,
                      (uint)(*pbVar6 >> 4) | (uint)*pbVar6 * 4,1,0xff);
    (&GetVoxelRemap(unsigned_char_const*)::remap)[lVar5] = (char)iVar2;
    pbVar6 = pbVar6 + 3;
  }
LAB_005f285b:
  for (lVar5 = 0; lVar5 < this->NumMips; lVar5 = lVar5 + 1) {
    pBVar3 = this->Mips[lVar5].SlabData;
    for (iVar2 = this->Mips[lVar5].OffsetX[this->Mips[lVar5].SizeX]; 2 < iVar2;
        iVar2 = (iVar2 - (uint)bVar1) + -3) {
      bVar1 = pBVar3[1];
      for (uVar4 = 0; bVar1 != uVar4; uVar4 = uVar4 + 1) {
        pBVar3[uVar4 + 3] = (&GetVoxelRemap(unsigned_char_const*)::remap)[pBVar3[uVar4 + 3]];
      }
      pBVar3 = pBVar3 + (ulong)bVar1 + 3;
    }
  }
  RemovePalette(this);
  return;
}

Assistant:

void FVoxel::Remap()
{
	if (Palette != NULL)
	{
		BYTE *remap = GetVoxelRemap(Palette);
		for (int i = 0; i < NumMips; ++i)
		{
			RemapVoxelSlabs((kvxslab_t *)Mips[i].SlabData, Mips[i].OffsetX[Mips[i].SizeX], remap);
		}
		RemovePalette();
	}
}